

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

void __thiscall HdlcAnalyzer::ProcessControlField(HdlcAnalyzer *this)

{
  long lVar1;
  bool bVar2;
  U64 UVar3;
  U64 UVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  Frame frame_1;
  HdlcByte byte;
  HdlcByte byte0;
  Frame frame;
  HdlcByte local_c8;
  long local_b0;
  undefined1 local_a8;
  undefined1 local_a7;
  vector<Frame,_std::allocator<Frame>_> *local_a0;
  HdlcByte local_98;
  HdlcByte local_78;
  U64 local_58;
  U64 UStack_50;
  ulong local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined1 local_37;
  
  if (this->mAbortFrame == false) {
    if (((this->mSettings)._M_ptr)->mHdlcControl == HDLC_BASIC_CONTROL_FIELD) {
      ReadByte(&local_c8,this);
      UStack_50 = local_c8.endSample;
      local_58 = local_c8.startSample;
      if (this->mAbortFrame != false) {
        return;
      }
      bVar2 = local_c8.escaped;
      uVar8 = local_c8._16_8_ & 0xff;
      Frame::Frame((Frame *)&local_58);
      local_38 = 3;
      local_40 = 0;
      local_37 = bVar2;
      local_48 = uVar8;
      std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,(Frame *)&local_58)
      ;
      this->mCurrentFrameIsSFrame = (local_c8.value & 3) == 1;
    }
    else {
      ReadByte(&local_78,this);
      if (this->mAbortFrame != false) {
        return;
      }
      Frame::Frame((Frame *)&local_58);
      local_58 = local_78.startSample;
      UStack_50 = local_78.endSample;
      local_38 = 4;
      local_40 = 0;
      local_37 = local_78.escaped;
      local_a0 = &this->mResultFrames;
      local_48 = (ulong)local_78.value;
      std::vector<Frame,_std::allocator<Frame>_>::push_back(local_a0,(Frame *)&local_58);
      bVar7 = (local_78.value & 2) + 1 & -(local_78.value & 1);
      this->mCurrentFrameIsSFrame = bVar7 == 1;
      if ((bVar7 != 3) &&
         (uVar5 = ((this->mSettings)._M_ptr)->mHdlcControl - HDLC_EXTENDED_CONTROL_FIELD_MOD_128,
         uVar5 < 3)) {
        lVar1 = *(long *)(&DAT_0010f0b8 + (ulong)uVar5 * 8);
        lVar6 = 1;
        do {
          ReadByte(&local_98,this);
          bVar2 = local_98.escaped;
          UVar4 = local_98.endSample;
          UVar3 = local_98.startSample;
          if (this->mAbortFrame != false) break;
          uVar8 = (ulong)local_98.value;
          Frame::Frame((Frame *)&local_c8);
          local_c8.startSample = UVar3;
          local_c8.endSample = UVar4;
          local_a8 = 4;
          local_a7 = bVar2;
          local_c8._16_8_ = uVar8;
          local_b0 = lVar6;
          std::vector<Frame,_std::allocator<Frame>_>::push_back(local_a0,(value_type *)&local_c8);
          Frame::~Frame((Frame *)&local_c8);
          lVar6 = lVar6 + 1;
        } while (lVar1 != lVar6);
      }
    }
    Frame::~Frame((Frame *)&local_58);
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessControlField()
{
    if( mAbortFrame )
    {
        return;
    }

    if( mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD ) // Basic Control Field of 1 byte
    {
        HdlcByte controlByte = ReadByte();
        if( mAbortFrame )
        {
            return;
        }

        U8 flag = ( controlByte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame = CreateFrame( HDLC_FIELD_BASIC_CONTROL, controlByte.startSample, controlByte.endSample, controlByte.value, 0, flag );
        AddFrameToResults( frame );

        HdlcFrameType frameType = GetFrameType( controlByte.value );
        mCurrentFrameIsSFrame = ( frameType == HDLC_S_FRAME );
    }
    else // Extended Control Field
    {
        // Read first byte and check type of frame
        HdlcByte byte0 = ReadByte();
        if( mAbortFrame )
        {
            return;
        }
        HdlcFrameType frameType = GetFrameType( byte0.value );
        U8 flag = ( byte0.escaped ) ? HDLC_ESCAPED_BYTE : 0;

        Frame frame0 = CreateFrame( HDLC_FIELD_EXTENDED_CONTROL, byte0.startSample, byte0.endSample, byte0.value, 0, flag );
        AddFrameToResults( frame0 );

        mCurrentFrameIsSFrame = ( frameType == HDLC_S_FRAME );

        if( frameType != HDLC_U_FRAME )
        {
            U32 ctlBytes = 0;
            switch( mSettings->mHdlcControl )
            {
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
                ctlBytes = 2;
                break;
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
                ctlBytes = 4;
                break;
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
                ctlBytes = 8;
                break;
            }
            for( U32 i = 1; i < ctlBytes; ++i )
            {
                HdlcByte byte = ReadByte();
                if( mAbortFrame )
                {
                    return;
                }
                U8 flag = ( byte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
                Frame frame = CreateFrame( HDLC_FIELD_EXTENDED_CONTROL, byte.startSample, byte.endSample, byte.value, i, flag );
                AddFrameToResults( frame );
            }
        }
    }
}